

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedFieldInfo.cpp
# Opt level: O3

void FixedFieldInfo::PopulateFixedField(Type *type,Var var,FixedFieldInfo *fixed)

{
  Type *pTVar1;
  FunctionInfo *pFVar2;
  FrameDisplay *pFVar3;
  bool bVar4;
  TSize TVar5;
  JavascriptFunction *obj;
  ScriptFunction *pSVar6;
  RecyclableObject *recyclableObject;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  pTVar1 = &(fixed->m_data).fieldValue;
  recyclableObject = (RecyclableObject *)var;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (fixed->m_data).fieldValue.ptr = var;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  (fixed->m_data).nextHasSameFixedField = '\0';
  if ((ulong)var >> 0x30 == 0 && var != (Var)0x0) {
    bVar4 = Js::VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)var);
    if (bVar4) {
      obj = Js::VarTo<Js::JavascriptFunction>(var);
      local_32.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObject((ValueType *)obj,recyclableObject);
      TVar5 = ValueType::GetRawData((ValueType *)&local_32.field_0);
      (fixed->m_data).valueType = TVar5;
      pFVar2 = (obj->functionInfo).ptr;
      pTVar1 = &(fixed->m_data).funcInfoAddr;
      Memory::Recycler::WBSetBit((char *)pTVar1);
      (fixed->m_data).funcInfoAddr.ptr = pFVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
      pFVar2 = (obj->functionInfo).ptr;
      (fixed->m_data).isClassCtor = (byte)(pFVar2->attributes >> 10) & 1;
      (fixed->m_data).localFuncId = pFVar2->functionId;
      bVar4 = Js::VarIs<Js::ScriptFunction>(var);
      if (bVar4) {
        pSVar6 = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
        pFVar3 = (pSVar6->environment).ptr;
        pTVar1 = &(fixed->m_data).environmentAddr;
        Memory::Recycler::WBSetBit((char *)pTVar1);
        (fixed->m_data).environmentAddr.ptr = pFVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
      }
    }
  }
  if (type != (Type *)0x0) {
    JITType::BuildFromJsType(type,(JITType *)&(fixed->m_data).type);
  }
  return;
}

Assistant:

void
FixedFieldInfo::PopulateFixedField(_In_opt_ Js::Type * type, _In_opt_ Js::Var var, _Out_ FixedFieldInfo * fixed)
{
    FixedFieldIDL * rawFF = fixed->GetRaw();
    rawFF->fieldValue = var;
    rawFF->nextHasSameFixedField = false;
    if (var != nullptr && Js::VarIs<Js::JavascriptFunction>(var))
    {
        Js::JavascriptFunction * funcObj = Js::VarTo<Js::JavascriptFunction>(var);
        rawFF->valueType = ValueType::FromObject(funcObj).GetRawData();
        rawFF->funcInfoAddr = (void*)funcObj->GetFunctionInfo();
        rawFF->isClassCtor = funcObj->GetFunctionInfo()->IsClassConstructor();
        rawFF->localFuncId = funcObj->GetFunctionInfo()->GetLocalFunctionId();
        if (Js::VarIs<Js::ScriptFunction>(var))
        {
            rawFF->environmentAddr = (void*)Js::VarTo<Js::ScriptFunction>(funcObj)->GetEnvironment();
        }
    }
    if (type != nullptr)
    {
        JITType::BuildFromJsType(type, (JITType*)&rawFF->type);
    }
}